

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O0

void __thiscall Assimp::ScaleProcess::Execute(ScaleProcess *this,aiScene *pScene)

{
  float *this_00;
  aiAnimation *paVar1;
  aiNodeAnim *paVar2;
  aiMesh *paVar3;
  aiBone *paVar4;
  aiAnimMesh *paVar5;
  aiVector3t<float> aVar6;
  aiVector3D *vertex_1;
  uint vertexID_1;
  aiAnimMesh *animMesh;
  uint animMeshID;
  aiMatrix4x4t<float> local_1f0;
  aiMatrix3x3t<float> local_1b0;
  undefined1 local_18c [8];
  aiMatrix4x4 RotMatrix;
  undefined1 local_140 [8];
  aiMatrix4x4 scaling;
  float local_f8;
  aiVector3t<float> local_ec;
  undefined1 local_e0 [8];
  aiMatrix4x4 translation;
  aiQuaternion rotation;
  aiVector3D scale;
  aiVector3D pos;
  aiBone *bone;
  uint boneID;
  aiVector3D *vertex;
  uint vertexID;
  aiMesh *mesh;
  uint meshID;
  aiVectorKey *vectorKey;
  uint posKey;
  aiNodeAnim *anim;
  uint animationChannel;
  aiAnimation *animation;
  uint animationID;
  aiScene *pScene_local;
  ScaleProcess *this_local;
  
  if ((this->mScale != 1.0) || (NAN(this->mScale))) {
    if ((this->mScale == 0.0) && (!NAN(this->mScale))) {
      __assert_fail("mScale != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x58,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene == (aiScene *)0x0) {
      __assert_fail("nullptr != pScene",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x59,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene->mRootNode == (aiNode *)0x0) {
      __assert_fail("nullptr != pScene->mRootNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x5a,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if ((pScene != (aiScene *)0x0) && (pScene->mRootNode != (aiNode *)0x0)) {
      for (animation._4_4_ = 0; animation._4_4_ < pScene->mNumAnimations;
          animation._4_4_ = animation._4_4_ + 1) {
        paVar1 = pScene->mAnimations[animation._4_4_];
        for (anim._4_4_ = 0; anim._4_4_ < paVar1->mNumChannels; anim._4_4_ = anim._4_4_ + 1) {
          paVar2 = paVar1->mChannels[anim._4_4_];
          for (vectorKey._4_4_ = 0; vectorKey._4_4_ < paVar2->mNumPositionKeys;
              vectorKey._4_4_ = vectorKey._4_4_ + 1) {
            aiVector3t<float>::operator*=
                      (&paVar2->mPositionKeys[vectorKey._4_4_].mValue,this->mScale);
          }
        }
      }
      for (mesh._4_4_ = 0; mesh._4_4_ < pScene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
        paVar3 = pScene->mMeshes[mesh._4_4_];
        for (vertex._4_4_ = 0; vertex._4_4_ < paVar3->mNumVertices; vertex._4_4_ = vertex._4_4_ + 1)
        {
          aiVector3t<float>::operator*=(paVar3->mVertices + vertex._4_4_,this->mScale);
        }
        for (bone._4_4_ = 0; bone._4_4_ < paVar3->mNumBones; bone._4_4_ = bone._4_4_ + 1) {
          paVar4 = paVar3->mBones[bone._4_4_];
          this_00 = &scale.y;
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)this_00);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&rotation.y);
          aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&translation.d3);
          aiMatrix4x4t<float>::Decompose
                    (&paVar4->mOffsetMatrix,(aiVector3t<float> *)&rotation.y,
                     (aiQuaterniont<float> *)&translation.d3,(aiVector3t<float> *)this_00);
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_e0);
          aVar6 = ::operator*((aiVector3t<float> *)this_00,this->mScale);
          scaling._56_8_ = aVar6._0_8_;
          local_ec.x = scaling.d3;
          local_ec.y = scaling.d4;
          local_f8 = aVar6.z;
          local_ec.z = local_f8;
          unique0x1000042f = aVar6;
          aiMatrix4x4t<float>::Translation(&local_ec,(aiMatrix4x4t<float> *)local_e0);
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_140);
          RotMatrix.d3 = rotation.y;
          RotMatrix.d4 = rotation.z;
          aiMatrix4x4t<float>::Scaling
                    ((aiVector3t<float> *)&RotMatrix.d3,(aiMatrix4x4t<float> *)local_140);
          aiQuaterniont<float>::GetMatrix(&local_1b0,(aiQuaterniont<float> *)&translation.d3);
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_18c,&local_1b0);
          aiMatrix4x4t<float>::operator*
                    ((aiMatrix4x4t<float> *)&stack0xfffffffffffffdd0,(aiMatrix4x4t<float> *)local_e0
                     ,(aiMatrix4x4t<float> *)local_18c);
          aiMatrix4x4t<float>::operator*
                    (&local_1f0,(aiMatrix4x4t<float> *)&stack0xfffffffffffffdd0,
                     (aiMatrix4x4t<float> *)local_140);
          memcpy(&paVar4->mOffsetMatrix,&local_1f0,0x40);
        }
        for (animMesh._4_4_ = 0; animMesh._4_4_ < paVar3->mNumAnimMeshes;
            animMesh._4_4_ = animMesh._4_4_ + 1) {
          paVar5 = paVar3->mAnimMeshes[animMesh._4_4_];
          for (vertex_1._4_4_ = 0; vertex_1._4_4_ < paVar5->mNumVertices;
              vertex_1._4_4_ = vertex_1._4_4_ + 1) {
            aiVector3t<float>::operator*=(paVar5->mVertices + vertex_1._4_4_,this->mScale);
          }
        }
      }
      traverseNodes(this,pScene->mRootNode,0);
    }
  }
  return;
}

Assistant:

void ScaleProcess::Execute( aiScene* pScene ) {
    if(mScale == 1.0f)  {
        return; // nothing to scale
    }
    
    ai_assert( mScale != 0 );
    ai_assert( nullptr != pScene );
    ai_assert( nullptr != pScene->mRootNode );

    if ( nullptr == pScene ) {
        return;
    }

    if ( nullptr == pScene->mRootNode ) {
        return;
    }
    
    // Process animations and update position transform to new unit system
    for( unsigned int animationID = 0; animationID < pScene->mNumAnimations; animationID++ )
    {
        aiAnimation* animation = pScene->mAnimations[animationID];

        for( unsigned int animationChannel = 0; animationChannel < animation->mNumChannels; animationChannel++)
        {
            aiNodeAnim* anim = animation->mChannels[animationChannel];
            
            for( unsigned int posKey = 0; posKey < anim->mNumPositionKeys; posKey++)
            {
                aiVectorKey& vectorKey = anim->mPositionKeys[posKey];
                vectorKey.mValue *= mScale;
            }
        }
    }

    for( unsigned int meshID = 0; meshID < pScene->mNumMeshes; meshID++)
    {
        aiMesh *mesh = pScene->mMeshes[meshID]; 
        
        // Reconstruct mesh vertexes to the new unit system
        for( unsigned int vertexID = 0; vertexID < mesh->mNumVertices; vertexID++)
        {
            aiVector3D& vertex = mesh->mVertices[vertexID];
            vertex *= mScale;
        }


        // bone placement / scaling
        for( unsigned int boneID = 0; boneID < mesh->mNumBones; boneID++)
        {
            // Reconstruct matrix by transform rather than by scale 
            // This prevent scale values being changed which can
            // be meaningful in some cases 
            // like when you want the modeller to see 1:1 compatibility.
            aiBone* bone = mesh->mBones[boneID];

            aiVector3D pos, scale;
            aiQuaternion rotation;

            bone->mOffsetMatrix.Decompose( scale, rotation, pos);
            
            aiMatrix4x4 translation;
            aiMatrix4x4::Translation( pos * mScale, translation );
            
            aiMatrix4x4 scaling;
            aiMatrix4x4::Scaling( aiVector3D(scale), scaling );

            aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

            bone->mOffsetMatrix = translation * RotMatrix * scaling;
        }


        // animation mesh processing
        // convert by position rather than scale.
        for( unsigned int animMeshID = 0; animMeshID < mesh->mNumAnimMeshes; animMeshID++)
        {
            aiAnimMesh * animMesh = mesh->mAnimMeshes[animMeshID];
            
            for( unsigned int vertexID = 0; vertexID < animMesh->mNumVertices; vertexID++)
            {
                aiVector3D& vertex = animMesh->mVertices[vertexID];
                vertex *= mScale;
            }
        }
    }

    traverseNodes( pScene->mRootNode );
}